

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesture.cpp
# Opt level: O2

bool __thiscall QGestureEvent::isAccepted(QGestureEvent *this,QGesture *gesture)

{
  bool bVar1;
  
  if (gesture != (QGesture *)0x0) {
    bVar1 = isAccepted(this,*(GestureType *)(*(long *)&gesture->field_0x8 + 0x78));
    return bVar1;
  }
  return false;
}

Assistant:

bool QGestureEvent::isAccepted(QGesture *gesture) const
{
    return gesture ? isAccepted(gesture->gestureType()) : false;
}